

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int32_t rle16_find_run(rle16_t *array,int32_t lenarray,uint16_t ikey)

{
  int iVar1;
  uint16_t max;
  uint16_t min;
  int32_t middleIndex;
  int32_t high;
  int32_t low;
  uint16_t ikey_local;
  int32_t lenarray_local;
  rle16_t *array_local;
  
  middleIndex = 0;
  _max = lenarray + -1;
  while( true ) {
    while( true ) {
      if (_max < middleIndex) {
        return -(middleIndex + 1);
      }
      iVar1 = middleIndex + _max >> 1;
      if (ikey <= (ushort)(array[iVar1].value + array[iVar1].length)) break;
      middleIndex = iVar1 + 1;
    }
    if (array[iVar1].value <= ikey) break;
    _max = iVar1 + -1;
  }
  return iVar1;
}

Assistant:

static inline int32_t rle16_find_run(const rle16_t *array, int32_t lenarray,
                                     uint16_t ikey) {
    int32_t low = 0;
    int32_t high = lenarray - 1;
    while (low <= high) {
        int32_t middleIndex = (low + high) >> 1;
        uint16_t min = array[middleIndex].value;
        uint16_t max = array[middleIndex].value + array[middleIndex].length;
        if (ikey > max) {
            low = middleIndex + 1;
        } else if (ikey < min) {
            high = middleIndex - 1;
        } else {
            return middleIndex;
        }
    }
    return -(low + 1);
}